

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlist.c
# Opt level: O2

dlist_t * dlist_search(dlist_head_t *head,void *data,_func_int_void_ptr_void_ptr *cmp)

{
  int iVar1;
  dlist_s *pdVar2;
  
  if ((head != (dlist_head_t *)0x0) && (pdVar2 = head->dlist, pdVar2 != (dlist_t *)0x0)) {
    for (; pdVar2 != (dlist_t *)0x0; pdVar2 = pdVar2->next) {
      iVar1 = (*cmp)(data,pdVar2->data);
      if (iVar1 != 0) {
        return pdVar2;
      }
    }
  }
  return (dlist_t *)0x0;
}

Assistant:

dlist_t *dlist_search(dlist_head_t *head,
      void *data,
      int (*cmp)(void *data, void *data2)) {
   dlist_t *dlist;

   if (!head || !head->dlist)
      return NULL;

   dlist = head->dlist;

   while (dlist) {
      if (cmp(data, dlist->data))
         return dlist;
      dlist = dlist->next;
   }

   return NULL;
}